

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_conn.cpp
# Opt level: O3

void __thiscall TcpConnection::do_read(TcpConnection *this)

{
  InputBuffer *this_00;
  int iVar1;
  Logger *pLVar2;
  undefined8 uVar3;
  __shared_ptr<TcpConnection,(__gnu_cxx::_Lock_policy)2> a_Stack_28 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  InputBuffer *local_18;
  
  this_00 = &this->tc_ibuf;
  iVar1 = InputBuffer::read_from_fd(this_00,this->tc_fd);
  if (iVar1 == 0) {
    pLVar2 = Logger::get_instance();
    if ((pLVar2->l_inited == false) && (-1 < pr_level)) {
      printf("[%-5s][%s:%d] logger must be inited before user!\n","error","do_read",0x33);
    }
    if (1 < (int)g_log_level) {
      pLVar2 = Logger::get_instance();
      Logger::write_log(pLVar2,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/net/tcp_conn.cpp"
                        ,"do_read",0x33,LOG_LEVEL_INFO,"connection closed by peer\n");
      pLVar2 = Logger::get_instance();
      Logger::flush(pLVar2);
    }
  }
  else {
    if (iVar1 != -1) {
      std::__shared_ptr<TcpConnection,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<TcpConnection,void>
                (a_Stack_28,(__weak_ptr<TcpConnection,_(__gnu_cxx::_Lock_policy)2> *)this);
      local_18 = this_00;
      if ((this->tc_message_cb).super__Function_base._M_manager != (_Manager_type)0x0) {
        (*(this->tc_message_cb)._M_invoker)
                  ((_Any_data *)&this->tc_message_cb,(shared_ptr<TcpConnection> *)a_Stack_28,
                   &local_18);
        if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
        }
        return;
      }
      uVar3 = std::__throw_bad_function_call();
      if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
      }
      _Unwind_Resume(uVar3);
    }
    if (-1 < pr_level) {
      printf("[%-5s][%s:%d] read data from socket error\n","error","do_read",0x2e);
    }
  }
  do_close(this);
  return;
}

Assistant:

void TcpConnection::do_read() {
    if (int ret = tc_ibuf.read_from_fd(tc_fd); ret == -1) {
        PR_ERROR("read data from socket error\n");
        this->do_close();
        return;
    }
    else if (ret == 0) {
        LOG_INFO("connection closed by peer\n");
        this->do_close();
        return;
    }

    tc_message_cb(shared_from_this(), &tc_ibuf);

    return;
}